

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

int __thiscall pbrt::TranslucentMaterial::writeTo(TranslucentMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  SP local_28;
  int32_t local_14;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity;
  local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_14 = BinaryWriter::serialize(binary,&local_28);
  BinaryWriter::writeRaw(binary,&local_14,4);
  if (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  BinaryWriter::writeRaw(binary,&this->reflect,0xc);
  BinaryWriter::writeRaw(binary,&this->transmit,0xc);
  BinaryWriter::writeRaw(binary,&this->kd,0xc);
  return 0x16;
}

Assistant:

int TranslucentMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(reflect);
    binary.write(transmit);
    binary.write(kd);
    return TYPE_TRANSLUCENT_MATERIAL;
  }